

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O0

void __thiscall
HFSubConsumer::HFSubConsumer
          (HFSubConsumer *this,HighFreqDataType *hf,size_t bfsize,consumer_queue_filter filter)

{
  int iVar1;
  undefined8 in_RCX;
  long in_RDX;
  HighFreqDataType *in_RSI;
  undefined8 *in_RDI;
  HighFreqDataType *in_stack_ffffffffffffff10;
  ConcurrentQueue<_zframe_t_*,_MyTraits> *queue;
  undefined4 in_stack_ffffffffffffff20;
  HighFreqDataType *obj;
  HighFreqDataType *in_stack_ffffffffffffff40;
  size_t in_stack_ffffffffffffff48;
  NetworkDataType in_stack_ffffffffffffff50;
  SubType in_stack_ffffffffffffffc4;
  undefined8 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  
  obj = (HighFreqDataType *)&stack0xffffffffffffff50;
  HighFreqDataType::HighFreqDataType(in_stack_ffffffffffffff40,obj);
  HighFreqSub::HighFreqSub
            ((HighFreqSub *)in_stack_ffffffffffffffd0,(HighFreqDataType *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc4);
  HighFreqDataType::~HighFreqDataType(in_stack_ffffffffffffff10);
  *in_RDI = &PTR__HFSubConsumer_005d5e38;
  in_RDI[0x17] = in_RDX + 1;
  queue = (ConcurrentQueue<_zframe_t_*,_MyTraits> *)(in_RDI + 0x18);
  iVar1 = HighFreqDataType::getByteSize(in_RSI);
  (queue->producerListTail)._M_b._M_p = (__pointer_type)(long)iVar1;
  in_RDI[0x19] = in_RCX;
  moodycamel::ConcurrentQueue<_zframe_t_*,_MyTraits>::ConcurrentQueue
            ((ConcurrentQueue<_zframe_t_*,_MyTraits> *)
             in_stack_ffffffffffffff50._vptr_NetworkDataType,in_stack_ffffffffffffff48,
             (size_t)in_stack_ffffffffffffff40,(size_t)obj);
  moodycamel::ProducerToken::ProducerToken<_zframe_t*,MyTraits>
            ((ProducerToken *)CONCAT44(iVar1,in_stack_ffffffffffffff20),queue);
  moodycamel::ConsumerToken::ConsumerToken<_zframe_t*,MyTraits>
            ((ConsumerToken *)(in_RDI + 0x68),
             (ConcurrentQueue<_zframe_t_*,_MyTraits> *)(in_RDI + 0x1a));
  moodycamel::ConsumerToken::ConsumerToken<_zframe_t*,MyTraits>
            ((ConsumerToken *)(in_RDI + 0x6c),
             (ConcurrentQueue<_zframe_t_*,_MyTraits> *)(in_RDI + 0x1a));
  in_RDI[0x70] = 0;
  in_RDI[0x71] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x72));
  *(undefined1 *)(in_RDI + 0x76) = 0;
  in_RDI[0x78] = 0;
  return;
}

Assistant:

HFSubConsumer::HFSubConsumer(HighFreqDataType hf, size_t bfsize, consumer_queue_filter filter)
    : HighFreqSub(hf, ST_CONSUMER),
      buffersize(bfsize+1),
      msgsize(hf.getByteSize()),
      queuefilter(filter),
      framequeue(buffersize, 1, 0),
      ptoken(framequeue),
      replacetoken(framequeue),
      consumetoken(framequeue),
      req(NULL),
      rep(NULL),
      waiting(false),
      lasttimestamp(0)
{

}